

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

char * debugline(char *p,char *fmt)

{
  char *in_RAX;
  char *pcVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  uint uVar4;
  stringformatter local_38;
  
  if (sourcestr != (char *)0x0) {
    uVar4 = 1;
    __s = sourcestr;
    local_38.buf = in_RAX;
    do {
      pcVar1 = strchr(__s,10);
      if (pcVar1 == (char *)0x0) {
        sVar2 = strlen(__s);
        pcVar1 = __s + sVar2;
      }
      if (pcVar1 < p || p < __s) {
        if (*pcVar1 == '\0') {
          iVar3 = 2;
        }
        else {
          __s = pcVar1 + 1;
          uVar4 = uVar4 + 1;
          iVar3 = 0;
        }
      }
      else {
        if (sourcefile == (char *)0x0) {
          local_38.buf = debugline::buf;
          stringformatter::operator()(&local_38,"%d: %s",(ulong)uVar4,fmt);
        }
        else {
          local_38.buf = debugline::buf;
          stringformatter::operator()(&local_38,"%s:%d: %s",sourcefile,(ulong)uVar4,fmt);
        }
        iVar3 = 1;
      }
    } while (iVar3 == 0);
    if (iVar3 != 2) {
      fmt = debugline::buf;
    }
  }
  return fmt;
}

Assistant:

static const char *debugline(const char *p, const char *fmt)
{
    if(!sourcestr) return fmt;
    int num = 1;
    const char *line = sourcestr;
    for(;;)
    {
        const char *end = strchr(line, '\n');
        if(!end) end = line + strlen(line);
        if(p >= line && p <= end)
        {
            static string buf;
            if(sourcefile) formatstring(buf)("%s:%d: %s", sourcefile, num, fmt);
            else formatstring(buf)("%d: %s", num, fmt);
            return buf;
        }
        if(!*end) break;
        line = end + 1;
        num++;
    }
    return fmt;
}